

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_bench.cc
# Opt level: O0

void sequential(fdb_kvs_handle *kv,int pos)

{
  void *key;
  size_t metalen;
  uint in_ESI;
  fdb_kvs_handle *in_RDI;
  fdb_doc *doc;
  char bodybuf [512];
  char metabuf [256];
  char keybuf [256];
  int i;
  void *in_stack_fffffffffffffbb0;
  char *keylen;
  fdb_doc **doc_00;
  fdb_doc *doc_01;
  char local_418 [512];
  fdb_doc *local_218 [32];
  char local_118 [264];
  uint local_10;
  uint local_c;
  fdb_kvs_handle *local_8;
  
  doc_01 = (fdb_doc *)0x0;
  local_c = in_ESI;
  local_8 = in_RDI;
  str_gen(local_418,0x200);
  for (local_10 = 0; (int)local_10 < 1000; local_10 = local_10 + 1) {
    sprintf(local_118,"%d_%dseqkey",(ulong)local_c,(ulong)local_10);
    sprintf((char *)local_218,"meta%d",(ulong)local_10);
    keylen = local_118;
    key = (void *)strlen(local_118);
    doc_00 = local_218;
    strlen((char *)local_218);
    metalen = strlen(local_418);
    fdb_doc_create(doc_00,key,(size_t)keylen,in_stack_fffffffffffffbb0,metalen,(void *)0x104ef4,
                   (size_t)doc_01);
    fdb_set(local_8,doc_01);
    fdb_doc_free((fdb_doc *)0x104f10);
  }
  return;
}

Assistant:

void sequential(fdb_kvs_handle *kv, int pos) {

    int i;
    char keybuf[256], metabuf[256], bodybuf[512];
    fdb_doc *doc = NULL;
    str_gen(bodybuf, 512);

    // load flat keys
    for (i = 0; i < 1000; i++){
        sprintf(keybuf, "%d_%dseqkey", pos, i);
        sprintf(metabuf, "meta%d", i);
        fdb_doc_create(&doc, (void*)keybuf, strlen(keybuf),
                       (void*)metabuf, strlen(metabuf),
                       (void*)bodybuf, strlen(bodybuf));
        fdb_set(kv, doc);
        fdb_doc_free(doc);
    }
}